

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

char * sqlite3ColumnType(Column *pCol,char *zDflt)

{
  long lVar1;
  size_t sVar2;
  char *in_RSI;
  long *in_RDI;
  char *local_8;
  
  if ((*(ushort *)((long)in_RDI + 0xe) & 4) == 0) {
    local_8 = in_RSI;
    if (*(byte *)(in_RDI + 1) >> 4 != 0) {
      local_8 = sqlite3StdType[(int)((*(byte *)(in_RDI + 1) >> 4) - 1)];
    }
  }
  else {
    lVar1 = *in_RDI;
    sVar2 = strlen((char *)*in_RDI);
    local_8 = (char *)(lVar1 + sVar2 + 1);
  }
  return local_8;
}

Assistant:

SQLITE_PRIVATE char *sqlite3ColumnType(Column *pCol, char *zDflt){
  if( pCol->colFlags & COLFLAG_HASTYPE ){
    return pCol->zCnName + strlen(pCol->zCnName) + 1;
  }else if( pCol->eCType ){
    assert( pCol->eCType<=SQLITE_N_STDTYPE );
    return (char*)sqlite3StdType[pCol->eCType-1];
  }else{
    return zDflt;
  }
}